

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alternate_mutex.hpp
# Opt level: O3

void __thiscall yamc::alternate::recursive_timed_mutex::unlock(recursive_timed_mutex *this)

{
  pthread_t pVar1;
  int iVar2;
  pthread_t pVar3;
  long lVar4;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)(this + 0x40));
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  lVar4 = *(long *)this;
  if (lVar4 != 0) {
    pVar1 = *(pthread_t *)(this + 8);
    pVar3 = pthread_self();
    if (pVar1 == pVar3) {
      lVar4 = lVar4 + -1;
      *(long *)this = lVar4;
      if (lVar4 == 0) {
        *(undefined8 *)(this + 8) = 0;
        std::condition_variable::notify_one();
      }
      pthread_mutex_unlock((pthread_mutex_t *)(this + 0x40));
      return;
    }
  }
  __assert_fail("0 < ncount_ && owner_ == std::this_thread::get_id()",
                "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/include/alternate_mutex.hpp"
                ,0xfa,"void yamc::alternate::recursive_timed_mutex::unlock()");
}

Assistant:

void unlock()
  {
    std::lock_guard<decltype(mtx_)> lk(mtx_);
    assert(0 < ncount_ && owner_ == std::this_thread::get_id());
    if (--ncount_ == 0) {
      owner_ = std::thread::id();
      cv_.notify_one();
    }
  }